

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Opnd * Lowerer::GetMissingItemOpndForAssignment(IRType type,Func *func)

{
  code *pcVar1;
  Opnd *pOVar2;
  intptr_t pMemLoc;
  MemRefOpnd *pMVar3;
  undefined4 *puVar4;
  int iVar5;
  undefined7 in_register_00000039;
  
  iVar5 = (int)CONCAT71(in_register_00000039,type);
  if (iVar5 != 0x17) {
    if (iVar5 == 10) {
      pMemLoc = ThreadContextInfo::GetNativeFloatArrayMissingItemAddr(func->m_threadContextInfo);
      pMVar3 = IR::MemRefOpnd::New(pMemLoc,TyFloat64,func,AddrOpndKindDynamicMisc);
      return &pMVar3->super_Opnd;
    }
    if (iVar5 != 3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      Js::Throw::ReportAssert
                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                 ,0x4942,"(false)","Unexpected type in Lowerer::GetMissingItemOpndForAssignment");
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  pOVar2 = GetMissingItemOpnd(type,func);
  return pOVar2;
}

Assistant:

IR::Opnd*
Lowerer::GetMissingItemOpndForAssignment(IRType type, Func *func)
{
    switch (type)
    {
    case TyVar:
    case TyInt32:
        return GetMissingItemOpnd(type, func);

    case TyFloat64:
        return IR::MemRefOpnd::New(func->GetThreadContextInfo()->GetNativeFloatArrayMissingItemAddr(), TyFloat64, func);

    default:
        AnalysisAssertMsg(false, "Unexpected type in Lowerer::GetMissingItemOpndForAssignment");
        __assume(false);
    }
}